

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestMultipleOutputsWithDeps::Run(ParserTestMultipleOutputsWithDeps *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  ManifestParser parser;
  State local_state;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  ManifestParser local_178;
  State local_118;
  
  State::State(&local_118);
  ManifestParser::ManifestParser(&local_178,&local_118,(FileReader *)0x0,(ManifestParserOptions)0x0)
  ;
  pTVar1 = g_current_test;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"rule cc\n  command = foo\n  deps = gcc\nbuild a.o b.o: cc c.cc\n"
             ,&local_1b9);
  bVar2 = ManifestParser::ParseTest(&local_178,&local_198,&local_1b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x361,
             "parser.ParseTest(\"rule cc\\n  command = foo\\n  deps = gcc\\n\" \"build a.o b.o: cc c.cc\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_198);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",&local_1b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x362,"\"\" == err");
  std::__cxx11::string::~string((string *)&local_1b8);
  State::~State(&local_118);
  return;
}

Assistant:

TEST_F(ParserTest, MultipleOutputsWithDeps) {
  State local_state;
  ManifestParser parser(&local_state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest("rule cc\n  command = foo\n  deps = gcc\n"
                               "build a.o b.o: cc c.cc\n",
                               &err));
  EXPECT_EQ("", err);
}